

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSNamespaceItem.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XSNamespaceItem::~XSNamespaceItem(XSNamespaceItem *this)

{
  XSNamedMap<xercesc_4_0::XSObject> *this_00;
  RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher> *this_01;
  void *in_RSI;
  ulong local_18;
  XMLSize_t i;
  XSNamespaceItem *this_local;
  
  for (local_18 = 0; local_18 < 0xe; local_18 = local_18 + 1) {
    if (((local_18 < 3) || (local_18 - 4 < 2)) || (local_18 == 10)) {
      this_00 = this->fComponentMap[local_18];
      if (this_00 != (XSNamedMap<xercesc_4_0::XSObject> *)0x0) {
        XSNamedMap<xercesc_4_0::XSObject>::~XSNamedMap(this_00);
        XMemory::operator_delete((XMemory *)this_00,in_RSI);
      }
      this_01 = this->fHashMap[local_18];
      if (this_01 != (RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher> *)0x0) {
        RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher>::~RefHashTableOf(this_01);
        XMemory::operator_delete((XMemory *)this_01,in_RSI);
      }
    }
  }
  if (this->fXSAnnotationList != (XSAnnotationList *)0x0) {
    (*(this->fXSAnnotationList->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).
      _vptr_BaseRefVectorOf[1])();
  }
  return;
}

Assistant:

XSNamespaceItem::~XSNamespaceItem()
{
    for (XMLSize_t i=0; i<XSConstants::MULTIVALUE_FACET; i++)
    {
        switch (i+1)
        {
            case XSConstants::ATTRIBUTE_DECLARATION:
            case XSConstants::ELEMENT_DECLARATION:
            case XSConstants::TYPE_DEFINITION:
            case XSConstants::ATTRIBUTE_GROUP_DEFINITION:
            case XSConstants::MODEL_GROUP_DEFINITION:
            case XSConstants::NOTATION_DECLARATION:
                delete fComponentMap[i];
                delete fHashMap[i];
                break;
        }
    }

    delete fXSAnnotationList;
}